

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register_tests.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::
SubjectSetRegisterTest_test_subscribe_then_unsubscribe_quickly_this_should_never_result_in_a_subscription_sync_Test
::TestBody(SubjectSetRegisterTest_test_subscribe_then_unsubscribe_quickly_this_should_never_result_in_a_subscription_sync_Test
           *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_350;
  AssertHelper local_330;
  Message local_328;
  bool local_319;
  undefined1 local_318 [8];
  AssertionResult gtest_ar__2;
  Subject local_298 [24];
  string local_280;
  AssertHelper local_260;
  Message local_258;
  bool local_249;
  undefined1 local_248 [8];
  AssertionResult gtest_ar__1;
  Subject local_1c8 [24];
  Subject local_1b0 [24];
  string local_198;
  AssertHelper local_178;
  Message local_170;
  bool local_161;
  undefined1 local_160 [8];
  AssertionResult gtest_ar_;
  optional<bidfx_public_api::price::pixie::SubscriptionSync> message;
  Subject local_b8 [24];
  SubjectSetRegister local_a0 [8];
  SubjectSetRegister subject_register;
  SubjectSetRegisterTest_test_subscribe_then_unsubscribe_quickly_this_should_never_result_in_a_subscription_sync_Test
  *this_local;
  
  bidfx_public_api::price::pixie::SubjectSetRegister::SubjectSetRegister(local_a0);
  bidfx_public_api::price::subject::Subject::Subject(local_b8,(Subject *)SS_SUBJECT0);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(local_a0,local_b8,0);
  subject::Subject::~Subject(local_b8);
  bidfx_public_api::price::subject::Subject::Subject
            ((Subject *)
             &message.
              super__Optional_base<bidfx_public_api::price::pixie::SubscriptionSync,_false,_false>.
              _M_payload.
              super__Optional_payload<bidfx_public_api::price::pixie::SubscriptionSync,_true,_false,_false>
              .super__Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>.
              _M_engaged,(Subject *)SS_SUBJECT1);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register
            (local_a0,&message.
                       super__Optional_base<bidfx_public_api::price::pixie::SubscriptionSync,_false,_false>
                       ._M_payload.
                       super__Optional_payload<bidfx_public_api::price::pixie::SubscriptionSync,_true,_false,_false>
                       .
                       super__Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>
                       ._M_engaged,1);
  subject::Subject::~Subject
            ((Subject *)
             &message.
              super__Optional_base<bidfx_public_api::price::pixie::SubscriptionSync,_false,_false>.
              _M_payload.
              super__Optional_payload<bidfx_public_api::price::pixie::SubscriptionSync,_true,_false,_false>
              .super__Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>.
              _M_engaged);
  bidfx_public_api::price::pixie::SubjectSetRegister::Unregister((Subject *)local_a0);
  bidfx_public_api::price::pixie::SubjectSetRegister::Unregister((Subject *)local_a0);
  bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
  local_161 = std::optional::operator_cast_to_bool((optional *)&gtest_ar_.message_);
  local_161 = !local_161;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_160,&local_161,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
  if (!bVar1) {
    testing::Message::Message(&local_170);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_198,(internal *)local_160,(AssertionResult *)0x3280be,"true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x17d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_178,&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    std::__cxx11::string::~string((string *)&local_198);
    testing::Message::~Message(&local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
  bidfx_public_api::price::subject::Subject::Subject(local_1b0,(Subject *)SS_SUBJECT0);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(local_a0,local_1b0,0);
  subject::Subject::~Subject(local_1b0);
  bidfx_public_api::price::subject::Subject::Subject(local_1c8,(Subject *)SS_SUBJECT1);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(local_a0,local_1c8,1);
  subject::Subject::~Subject(local_1c8);
  bidfx_public_api::price::pixie::SubjectSetRegister::Unregister((Subject *)local_a0);
  bidfx_public_api::price::pixie::SubjectSetRegister::Unregister((Subject *)local_a0);
  bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
  std::optional<bidfx_public_api::price::pixie::SubscriptionSync>::operator=
            ((optional<bidfx_public_api::price::pixie::SubscriptionSync> *)&gtest_ar_.message_,
             (optional<bidfx_public_api::price::pixie::SubscriptionSync> *)&gtest_ar__1.message_);
  std::optional<bidfx_public_api::price::pixie::SubscriptionSync>::~optional
            ((optional<bidfx_public_api::price::pixie::SubscriptionSync> *)&gtest_ar__1.message_);
  local_249 = std::optional::operator_cast_to_bool((optional *)&gtest_ar_.message_);
  local_249 = !local_249;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_248,&local_249,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
  if (!bVar1) {
    testing::Message::Message(&local_258);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_280,(internal *)local_248,(AssertionResult *)0x3280be,"true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x185,pcVar2);
    testing::internal::AssertHelper::operator=(&local_260,&local_258);
    testing::internal::AssertHelper::~AssertHelper(&local_260);
    std::__cxx11::string::~string((string *)&local_280);
    testing::Message::~Message(&local_258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
  bidfx_public_api::price::subject::Subject::Subject(local_298,(Subject *)SS_SUBJECT2);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(local_a0,local_298,0);
  subject::Subject::~Subject(local_298);
  bidfx_public_api::price::pixie::SubjectSetRegister::Unregister((Subject *)local_a0);
  bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
  std::optional<bidfx_public_api::price::pixie::SubscriptionSync>::operator=
            ((optional<bidfx_public_api::price::pixie::SubscriptionSync> *)&gtest_ar_.message_,
             (optional<bidfx_public_api::price::pixie::SubscriptionSync> *)&gtest_ar__2.message_);
  std::optional<bidfx_public_api::price::pixie::SubscriptionSync>::~optional
            ((optional<bidfx_public_api::price::pixie::SubscriptionSync> *)&gtest_ar__2.message_);
  local_319 = std::optional::operator_cast_to_bool((optional *)&gtest_ar_.message_);
  local_319 = !local_319;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_318,&local_319,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_318);
  if (!bVar1) {
    testing::Message::Message(&local_328);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_350,(internal *)local_318,(AssertionResult *)0x3280be,"true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_330,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x18b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_330,&local_328);
    testing::internal::AssertHelper::~AssertHelper(&local_330);
    std::__cxx11::string::~string((string *)&local_350);
    testing::Message::~Message(&local_328);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_318);
  std::optional<bidfx_public_api::price::pixie::SubscriptionSync>::~optional
            ((optional<bidfx_public_api::price::pixie::SubscriptionSync> *)&gtest_ar_.message_);
  SubjectSetRegister::~SubjectSetRegister(local_a0);
  return;
}

Assistant:

TEST(SubjectSetRegisterTest, test_subscribe_then_unsubscribe_quickly_this_should_never_result_in_a_subscription_sync)
{
    SubjectSetRegister subject_register = SubjectSetRegister();
    subject_register.Register(SS_SUBJECT0, false);
    subject_register.Register(SS_SUBJECT1, true);
    subject_register.Unregister(SS_SUBJECT0);
    subject_register.Unregister(SS_SUBJECT1);

    std::optional<SubscriptionSync> message = subject_register.NextSubscriptionSync();
    EXPECT_FALSE(message);

    subject_register.Register(SS_SUBJECT0, false);
    subject_register.Register(SS_SUBJECT1, true);
    subject_register.Unregister(SS_SUBJECT0);
    subject_register.Unregister(SS_SUBJECT1);

    message = subject_register.NextSubscriptionSync();
    EXPECT_FALSE(message);

    subject_register.Register(SS_SUBJECT2, false);
    subject_register.Unregister(SS_SUBJECT2);

    message = subject_register.NextSubscriptionSync();
    EXPECT_FALSE(message);
}